

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsGetEntityTypeFromName(char *name,FmsEntityType *ent_type)

{
  int iVar1;
  undefined4 *in_RSI;
  char *in_RDI;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else if (in_RSI == (undefined4 *)0x0) {
    local_4 = 2;
  }
  else {
    iVar1 = strcmp("FMS_VERTEX",in_RDI);
    if (iVar1 == 0) {
      *in_RSI = 0;
    }
    else {
      iVar1 = strcmp("FMS_EDGE",in_RDI);
      if (iVar1 == 0) {
        *in_RSI = 1;
      }
      else {
        iVar1 = strcmp("FMS_TRIANGLE",in_RDI);
        if (iVar1 == 0) {
          *in_RSI = 2;
        }
        else {
          iVar1 = strcmp("FMS_QUADRILATERAL",in_RDI);
          if (iVar1 == 0) {
            *in_RSI = 3;
          }
          else {
            iVar1 = strcmp("FMS_TETRAHEDRON",in_RDI);
            if (iVar1 == 0) {
              *in_RSI = 4;
            }
            else {
              iVar1 = strcmp("FMS_HEXAHEDRON",in_RDI);
              if (iVar1 == 0) {
                *in_RSI = 5;
              }
              else {
                iVar1 = strcmp("FMS_WEDGE",in_RDI);
                if (iVar1 == 0) {
                  *in_RSI = 6;
                }
                else {
                  iVar1 = strcmp("FMS_PYRAMID",in_RDI);
                  if (iVar1 != 0) {
                    return 3;
                  }
                  *in_RSI = 7;
                }
              }
            }
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsGetEntityTypeFromName(const char * const name, FmsEntityType *ent_type) {
  if(!name) E_RETURN(1);
  if(!ent_type) E_RETURN(2);

  if(strcmp(FmsEntityTypeNames[FMS_VERTEX], name) == 0)
    *ent_type = FMS_VERTEX;
  else if(strcmp(FmsEntityTypeNames[FMS_EDGE], name) == 0)
    *ent_type = FMS_EDGE;
  else if(strcmp(FmsEntityTypeNames[FMS_TRIANGLE], name) == 0)
    *ent_type = FMS_TRIANGLE;
  else if(strcmp(FmsEntityTypeNames[FMS_QUADRILATERAL], name) == 0)
    *ent_type = FMS_QUADRILATERAL;
  else if(strcmp(FmsEntityTypeNames[FMS_TETRAHEDRON], name) == 0)
    *ent_type = FMS_TETRAHEDRON;
  else if(strcmp(FmsEntityTypeNames[FMS_HEXAHEDRON], name) == 0)
    *ent_type = FMS_HEXAHEDRON;
  else if(strcmp(FmsEntityTypeNames[FMS_WEDGE], name) == 0)
    *ent_type = FMS_WEDGE;
  else if(strcmp(FmsEntityTypeNames[FMS_PYRAMID], name) == 0)
    *ent_type = FMS_PYRAMID;
  else
    E_RETURN(3);

  return 0;
}